

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sort_state.cpp
# Opt level: O3

void __thiscall
duckdb::GlobalSortState::GlobalSortState
          (GlobalSortState *this,ClientContext *context_p,
          vector<duckdb::BoundOrderByNode,_true> *orders,RowLayout *payload_layout)

{
  idx_t iVar1;
  undefined7 uVar2;
  BufferManager *pBVar3;
  
  this->context = context_p;
  (this->lock).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->lock).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->lock).super___mutex_base._M_mutex + 0x10) = 0;
  (this->lock).super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
  (this->lock).super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0;
  pBVar3 = BufferManager::GetBufferManager(context_p);
  this->buffer_manager = pBVar3;
  SortLayout::SortLayout(&this->sort_layout,orders);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)
             &this->payload_layout,
             (vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)payload_layout);
  (this->payload_layout).row_width = payload_layout->row_width;
  iVar1 = payload_layout->data_width;
  (this->payload_layout).flag_width = payload_layout->flag_width;
  (this->payload_layout).data_width = iVar1;
  ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&(this->payload_layout).offsets.
              super_vector<unsigned_long,_std::allocator<unsigned_long>_>,
             &(payload_layout->offsets).super_vector<unsigned_long,_std::allocator<unsigned_long>_>)
  ;
  uVar2 = *(undefined7 *)&payload_layout->field_0x49;
  iVar1 = payload_layout->heap_pointer_offset;
  (this->payload_layout).all_constant = payload_layout->all_constant;
  *(undefined7 *)&(this->payload_layout).field_0x49 = uVar2;
  (this->payload_layout).heap_pointer_offset = iVar1;
  (this->sorted_blocks).
  super_vector<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->sorted_blocks).
  super_vector<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->sorted_blocks).
  super_vector<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->sorted_blocks_temp).
  super_vector<duckdb::vector<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>,_true>,_std::allocator<duckdb::vector<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>,_true>_>_>
  .
  super__Vector_base<duckdb::vector<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>,_true>,_std::allocator<duckdb::vector<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->sorted_blocks_temp).
  super_vector<duckdb::vector<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>,_true>,_std::allocator<duckdb::vector<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>,_true>_>_>
  .
  super__Vector_base<duckdb::vector<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>,_true>,_std::allocator<duckdb::vector<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->sorted_blocks_temp).
  super_vector<duckdb::vector<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>,_true>,_std::allocator<duckdb::vector<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>,_true>_>_>
  .
  super__Vector_base<duckdb::vector<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>,_true>,_std::allocator<duckdb::vector<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->odd_one_out).
  super_unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>_>._M_t.
  super___uniq_ptr_impl<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::SortedBlock_*,_std::default_delete<duckdb::SortedBlock>_>.
  super__Head_base<0UL,_duckdb::SortedBlock_*,_false>._M_head_impl = (SortedBlock *)0x0;
  (this->heap_blocks).
  super_vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->heap_blocks).
  super_vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->heap_blocks).
  super_vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->pinned_blocks).super_vector<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>.
  super__Vector_base<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->pinned_blocks).super_vector<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>.
  super__Vector_base<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->pinned_blocks).super_vector<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>.
  super__Vector_base<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->block_capacity = 0;
  this->external = false;
  return;
}

Assistant:

GlobalSortState::GlobalSortState(ClientContext &context_p, const vector<BoundOrderByNode> &orders,
                                 RowLayout &payload_layout)
    : context(context_p), buffer_manager(BufferManager::GetBufferManager(context)), sort_layout(SortLayout(orders)),
      payload_layout(payload_layout), block_capacity(0), external(false) {
}